

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListFuncArgs(Parse *pParse,SrcList *p,ExprList *pList)

{
  long lVar1;
  undefined8 in_RDX;
  int *in_RSI;
  SrcItem *pItem;
  ExprList *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  
  if (in_RSI == (int *)0x0) {
    sqlite3ExprListDelete(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    lVar1 = (long)(*in_RSI + -1) * 0x48;
    *(undefined8 *)(in_RSI + (long)(*in_RSI + -1) * 0x12 + 0xc) = in_RDX;
    *(ushort *)((long)in_RSI + lVar1 + 0x21) = *(ushort *)((long)in_RSI + lVar1 + 0x21) & 0xfff7 | 8
    ;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListFuncArgs(Parse *pParse, SrcList *p, ExprList *pList){
  if( p ){
    SrcItem *pItem = &p->a[p->nSrc-1];
    assert( pItem->fg.notIndexed==0 );
    assert( pItem->fg.isIndexedBy==0 );
    assert( pItem->fg.isTabFunc==0 );
    pItem->u1.pFuncArg = pList;
    pItem->fg.isTabFunc = 1;
  }else{
    sqlite3ExprListDelete(pParse->db, pList);
  }
}